

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_improbe_(MPIABI_Fint *source,MPIABI_Fint *tag,MPIABI_Fint *comm,int *flag,
                    MPIABI_Fint *message,MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_improbe_();
  return;
}

Assistant:

void mpiabi_improbe_(
  const MPIABI_Fint * source,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  int * flag,
  MPIABI_Fint * message,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_improbe_(
    source,
    tag,
    comm,
    flag,
    message,
    status,
    ierror
  );
}